

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatVec.c
# Opt level: O2

int Msat_IntVecPushUnique(Msat_IntVec_t *p,int Entry)

{
  int *piVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar3 = 0;
  uVar2 = (ulong)(uint)p->nSize;
  if (p->nSize < 1) {
    uVar2 = uVar3;
  }
  do {
    if (uVar2 == uVar3) {
      Msat_IntVecPush(p,Entry);
      return 0;
    }
    piVar1 = p->pArray + uVar3;
    uVar3 = uVar3 + 1;
  } while (*piVar1 != Entry);
  return 1;
}

Assistant:

int Msat_IntVecPushUnique( Msat_IntVec_t * p, int Entry )
{
    int i;
    for ( i = 0; i < p->nSize; i++ )
        if ( p->pArray[i] == Entry )
            return 1;
    Msat_IntVecPush( p, Entry );
    return 0;
}